

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O2

void array_run_container_intersection
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  int iVar2;
  int32_t length;
  rle16_t *prVar3;
  long lVar4;
  _Bool _Var5;
  int pos;
  ushort uVar6;
  int iVar7;
  long lVar8;
  uint16_t min;
  bool bVar9;
  uint local_44;
  
  _Var5 = run_container_is_full(src_2);
  if (_Var5) {
    if (dst != src_1) {
      array_container_copy(src_1,dst);
      return;
    }
  }
  else {
    if (dst->capacity < src_1->cardinality) {
      array_container_grow(dst,src_1->cardinality,false);
    }
    iVar2 = src_2->n_runs;
    if (iVar2 != 0) {
      prVar3 = src_2->runs;
      min = prVar3->value;
      uVar6 = prVar3->length;
      length = src_1->cardinality;
      pos = 0;
      local_44 = 0;
      lVar8 = 0;
      while (pos < length) {
        uVar1 = src_1->array[pos];
        iVar7 = (int)lVar8;
        lVar8 = (long)iVar7;
        iVar7 = (iVar2 + -1) - iVar7;
        while ((uint)uVar6 + (uint)min < (uint)uVar1) {
          bVar9 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          if (bVar9) goto LAB_00117553;
          min = prVar3[lVar8 + 1].value;
          lVar4 = lVar8 + 1;
          lVar8 = lVar8 + 1;
          uVar6 = prVar3[lVar4].length;
        }
        if (uVar1 < min) {
          pos = advanceUntil(src_1->array,pos,length,min);
        }
        else {
          dst->array[local_44] = uVar1;
          local_44 = local_44 + 1;
          pos = pos + 1;
        }
      }
LAB_00117553:
      dst->cardinality = local_44;
    }
  }
  return;
}

Assistant:

void array_run_container_intersection(const array_container_t *src_1,
                                      const run_container_t *src_2,
                                      array_container_t *dst) {
    if (run_container_is_full(src_2)) {
        if (dst != src_1) array_container_copy(src_1, dst);
        return;
    }
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    if (src_2->n_runs == 0) {
        return;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                dst->cardinality = newcard;
                return;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            dst->array[newcard] = arrayval;
            newcard++;
            arraypos++;
        }
    }
    dst->cardinality = newcard;
}